

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::swizzlePixels
               (PixelBufferAccess *dst,ConstPixelBufferAccess *src,MaybeTextureSwizzle *swizzle)

{
  ChannelType CVar1;
  int i_2;
  ulong uVar2;
  int iVar3;
  int x;
  long lVar4;
  int iVar5;
  int iVar6;
  ChannelOrder CVar7;
  Vector<int,_4> res;
  undefined1 local_78 [32];
  TextureFormat local_58;
  int aiStack_50 [4];
  ChannelOrder local_40;
  ChannelOrder local_3c;
  ChannelOrder local_38;
  ChannelOrder local_34;
  
  local_78._24_8_ = dst;
  if ((swizzle->m_isSome != true) ||
     (((((swizzle->m_swizzle).m_data[0] == TEXTURESWIZZLECOMPONENT_R &&
        ((swizzle->m_swizzle).m_data[1] == TEXTURESWIZZLECOMPONENT_G)) &&
       ((swizzle->m_swizzle).m_data[2] == TEXTURESWIZZLECOMPONENT_B)) &&
      ((swizzle->m_swizzle).m_data[3] == TEXTURESWIZZLECOMPONENT_A)))) {
    tcu::copy((EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)src);
    return;
  }
  CVar1 = (dst->super_ConstPixelBufferAccess).m_format.type;
  uVar2 = (ulong)CVar1;
  x = (int)src;
  if (uVar2 < 0x22) {
    if ((0x58UL >> (uVar2 & 0x3f) & 1) != 0) {
      if ((src->m_size).m_data[2] < 1) {
        return;
      }
      iVar5 = 0;
      do {
        if (0 < (src->m_size).m_data[1]) {
          iVar6 = 0;
          do {
            if (0 < (src->m_size).m_data[0]) {
              iVar3 = 0;
              do {
                tcu::ConstPixelBufferAccess::getPixelT<float>
                          ((ConstPixelBufferAccess *)local_78,x,iVar3,iVar6);
                local_58.order = R;
                local_58.type = SNORM_INT8;
                aiStack_50[0] = 0;
                aiStack_50[1] = 0;
                lVar4 = 0;
                do {
                  switch((swizzle->m_swizzle).m_data[lVar4]) {
                  case TEXTURESWIZZLECOMPONENT_R:
                    CVar7 = local_78._0_4_;
                    break;
                  case TEXTURESWIZZLECOMPONENT_G:
                    CVar7 = local_78._4_4_;
                    break;
                  case TEXTURESWIZZLECOMPONENT_B:
                    CVar7 = local_78._8_4_;
                    break;
                  case TEXTURESWIZZLECOMPONENT_A:
                    CVar7 = local_78._12_4_;
                    break;
                  case TEXTURESWIZZLECOMPONENT_ZERO:
                    CVar7 = R;
                    break;
                  case TEXTURESWIZZLECOMPONENT_ONE:
                    CVar7 = 0x3f800000;
                    break;
                  default:
                    CVar7 = 0xbf800000;
                  }
                  (&local_58.order)[lVar4] = CVar7;
                  lVar4 = lVar4 + 1;
                } while (lVar4 != 4);
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)local_78._24_8_,(Vec4 *)&local_58,iVar3,iVar6,iVar5)
                ;
                iVar3 = iVar3 + 1;
              } while (iVar3 < (src->m_size).m_data[0]);
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 < (src->m_size).m_data[1]);
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 < (src->m_size).m_data[2]);
      return;
    }
    if ((0x2c0000000U >> (uVar2 & 0x3f) & 1) != 0) {
      if ((src->m_size).m_data[2] < 1) {
        return;
      }
      iVar5 = 0;
      do {
        if (0 < (src->m_size).m_data[1]) {
          iVar6 = 0;
          do {
            if (0 < (src->m_size).m_data[0]) {
              iVar3 = 0;
              do {
                tcu::ConstPixelBufferAccess::getPixelT<unsigned_int>
                          ((ConstPixelBufferAccess *)&local_40,x,iVar3,iVar6);
                local_78._0_4_ = R;
                local_78._4_4_ = SNORM_INT8;
                local_78._8_4_ = 0;
                local_78._12_4_ = 0;
                lVar4 = 0;
                do {
                  switch((swizzle->m_swizzle).m_data[lVar4]) {
                  case TEXTURESWIZZLECOMPONENT_R:
                    CVar7 = local_40;
                    break;
                  case TEXTURESWIZZLECOMPONENT_G:
                    CVar7 = local_3c;
                    break;
                  case TEXTURESWIZZLECOMPONENT_B:
                    CVar7 = local_38;
                    break;
                  case TEXTURESWIZZLECOMPONENT_A:
                    CVar7 = local_34;
                    break;
                  case TEXTURESWIZZLECOMPONENT_ZERO:
                    CVar7 = R;
                    break;
                  case TEXTURESWIZZLECOMPONENT_ONE:
                    CVar7 = A;
                    break;
                  default:
                    CVar7 = ~R;
                  }
                  *(ChannelOrder *)(local_78 + lVar4 * 4) = CVar7;
                  lVar4 = lVar4 + 1;
                } while (lVar4 != 4);
                local_58.order = local_78._0_4_;
                local_58.type = local_78._4_4_;
                aiStack_50[0] = local_78._8_4_;
                aiStack_50[1] = local_78._12_4_;
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)local_78._24_8_,(IVec4 *)&local_58,iVar3,iVar6,iVar5
                          );
                iVar3 = iVar3 + 1;
              } while (iVar3 < (src->m_size).m_data[0]);
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 < (src->m_size).m_data[1]);
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 < (src->m_size).m_data[2]);
      return;
    }
  }
  if ((CVar1 - SIGNED_INT8 < 3) && (0 < (src->m_size).m_data[2])) {
    iVar5 = 0;
    do {
      if (0 < (src->m_size).m_data[1]) {
        iVar6 = 0;
        do {
          if (0 < (src->m_size).m_data[0]) {
            iVar3 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixelT<int>
                        ((ConstPixelBufferAccess *)local_78,x,iVar3,iVar6);
              local_58.order = R;
              local_58.type = SNORM_INT8;
              aiStack_50[0] = 0;
              aiStack_50[1] = 0;
              lVar4 = 0;
              do {
                switch((swizzle->m_swizzle).m_data[lVar4]) {
                case TEXTURESWIZZLECOMPONENT_R:
                  CVar7 = local_78._0_4_;
                  break;
                case TEXTURESWIZZLECOMPONENT_G:
                  CVar7 = local_78._4_4_;
                  break;
                case TEXTURESWIZZLECOMPONENT_B:
                  CVar7 = local_78._8_4_;
                  break;
                case TEXTURESWIZZLECOMPONENT_A:
                  CVar7 = local_78._12_4_;
                  break;
                case TEXTURESWIZZLECOMPONENT_ZERO:
                  CVar7 = R;
                  break;
                case TEXTURESWIZZLECOMPONENT_ONE:
                  CVar7 = A;
                  break;
                default:
                  CVar7 = ~R;
                }
                (&local_58.order)[lVar4] = CVar7;
                lVar4 = lVar4 + 1;
              } while (lVar4 != 4);
              tcu::PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)local_78._24_8_,(IVec4 *)&local_58,iVar3,iVar6,iVar5);
              iVar3 = iVar3 + 1;
            } while (iVar3 < (src->m_size).m_data[0]);
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 < (src->m_size).m_data[1]);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < (src->m_size).m_data[2]);
  }
  return;
}

Assistant:

static void swizzlePixels (const PixelBufferAccess& dst, const ConstPixelBufferAccess& src, const MaybeTextureSwizzle& swizzle)
{
	if (isDepthFormat(dst.getFormat()))
		DE_ASSERT(swizzle.isNone() || swizzle.isIdentitySwizzle());

	if (swizzle.isNone() || swizzle.isIdentitySwizzle())
		tcu::copy(dst, src);
	else if (isUnormFormatType(dst.getFormat().type))
		swizzlePixels<float>(dst, src, swizzle);
	else if (isUIntFormatType(dst.getFormat().type))
		swizzlePixels<deUint32>(dst, src, swizzle);
	else if (isSIntFormatType(dst.getFormat().type))
		swizzlePixels<deInt32>(dst, src, swizzle);
	else
		DE_ASSERT(false);
}